

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_15c76d4::AV1FwdTxfm2d_RunFwdAccuracyCheck_Test::TestBody
          (AV1FwdTxfm2d_RunFwdAccuracyCheck_Test *this)

{
  int iVar1;
  uint uVar2;
  double *pdVar3;
  int32_t *piVar4;
  double *pdVar5;
  uint16_t uVar6;
  int iVar7;
  Message *pMVar8;
  int iVar9;
  int ni;
  long lVar10;
  ulong uVar11;
  SEARCH_METHODS *pSVar12;
  ulong uVar13;
  double dVar14;
  double actual_max_error;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_98;
  AssertionResult gtest_ar;
  uint local_7c;
  TX_TYPE *local_78;
  double local_70;
  TX_SIZE *local_68;
  int *local_60;
  int *local_58;
  double *local_50;
  AssertHelper local_48;
  double local_40;
  ACMRandom rnd;
  
  rnd.random_.state_ = (Random)0xbaba;
  local_58 = &(this->super_AV1FwdTxfm2d).tx_width_;
  local_78 = &(this->super_AV1FwdTxfm2d).tx_type_;
  local_60 = &(this->super_AV1FwdTxfm2d).tx_height_;
  local_68 = &(this->super_AV1FwdTxfm2d).tx_size_;
  local_50 = &(this->super_AV1FwdTxfm2d).max_error_;
  dVar14 = 0.0;
  iVar9 = 0;
  do {
    iVar7 = (this->super_AV1FwdTxfm2d).count_;
    if (iVar7 <= iVar9) {
LAB_0062c835:
      local_40 = (dVar14 / (this->super_AV1FwdTxfm2d).amplify_factor_) / (double)iVar7;
      testing::internal::CmpHelperGE<double,double>
                ((internal *)&gtest_ar,"max_avg_error_","avg_abs_error",
                 &(this->super_AV1FwdTxfm2d).max_avg_error_,&local_40);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&actual_max_error);
        std::operator<<((ostream *)((long)actual_max_error + 0x10),"tx_size = ");
        pMVar8 = testing::Message::operator<<((Message *)&actual_max_error,local_68);
        pMVar8 = testing::Message::operator<<(pMVar8,(char (*) [13])", tx_type = ");
        pMVar8 = testing::Message::operator<<(pMVar8,local_78);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pSVar12 = "";
        }
        else {
          pSVar12 = *(SEARCH_METHODS **)
                     gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_fwd_txfm2d_test.cc"
                   ,0x73,(char *)pSVar12);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,pMVar8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
        if (actual_max_error != 0.0) {
          (**(code **)(*(long *)actual_max_error + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      return;
    }
    local_70 = dVar14;
    for (lVar10 = 0; lVar10 < (this->super_AV1FwdTxfm2d).txfm2d_size_; lVar10 = lVar10 + 1) {
      uVar6 = libaom_test::ACMRandom::Rand16(&rnd);
      (this->super_AV1FwdTxfm2d).input_[lVar10] = uVar6 & 0x3ff;
      (this->super_AV1FwdTxfm2d).ref_input_[lVar10] = (double)(uVar6 & 0x3ff);
      (this->super_AV1FwdTxfm2d).output_[lVar10] = 0;
      (this->super_AV1FwdTxfm2d).ref_output_[lVar10] = 0.0;
    }
    (*(this->super_AV1FwdTxfm2d).fwd_txfm_)
              ((this->super_AV1FwdTxfm2d).input_,(this->super_AV1FwdTxfm2d).output_,
               (this->super_AV1FwdTxfm2d).tx_width_,(this->super_AV1FwdTxfm2d).tx_type_,10);
    iVar7 = (this->super_AV1FwdTxfm2d).ud_flip_;
    iVar1 = (this->super_AV1FwdTxfm2d).lr_flip_;
    if (iVar7 == 0 || iVar1 == 0) {
      if (iVar1 == 0) {
        if (iVar7 != 0) {
          iVar7 = (this->super_AV1FwdTxfm2d).tx_width_;
          libaom_test::flipud<double>
                    ((this->super_AV1FwdTxfm2d).ref_input_,iVar7,
                     (this->super_AV1FwdTxfm2d).tx_height_,iVar7);
        }
      }
      else {
        iVar7 = (this->super_AV1FwdTxfm2d).tx_width_;
        libaom_test::fliplr<double>
                  ((this->super_AV1FwdTxfm2d).ref_input_,iVar7,(this->super_AV1FwdTxfm2d).tx_height_
                   ,iVar7);
      }
    }
    else {
      iVar7 = (this->super_AV1FwdTxfm2d).tx_width_;
      libaom_test::fliplrud<double>
                ((this->super_AV1FwdTxfm2d).ref_input_,iVar7,(this->super_AV1FwdTxfm2d).tx_height_,
                 iVar7);
    }
    libaom_test::reference_hybrid_2d
              ((this->super_AV1FwdTxfm2d).ref_input_,(this->super_AV1FwdTxfm2d).ref_output_,
               (this->super_AV1FwdTxfm2d).tx_type_,(this->super_AV1FwdTxfm2d).tx_size_);
    actual_max_error = 0.0;
    uVar2 = (this->super_AV1FwdTxfm2d).txfm2d_size_;
    pdVar3 = (this->super_AV1FwdTxfm2d).ref_output_;
    piVar4 = (this->super_AV1FwdTxfm2d).output_;
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    for (uVar13 = 0; pdVar5 = local_50, uVar2 != uVar13; uVar13 = uVar13 + 1) {
      dVar14 = round(pdVar3[uVar13]);
      pdVar3[uVar13] = dVar14;
      dVar14 = ABS((double)piVar4[uVar13] - dVar14) / (this->super_AV1FwdTxfm2d).amplify_factor_;
      if (actual_max_error <= dVar14) {
        actual_max_error = dVar14;
      }
    }
    testing::internal::CmpHelperGE<double,double>
              ((internal *)&gtest_ar,"max_error_","actual_max_error",local_50,&actual_max_error);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_98);
      std::operator<<((ostream *)(local_98._M_head_impl + 0x10),"tx_w: ");
      pMVar8 = testing::Message::operator<<((Message *)&local_98,local_58);
      pMVar8 = testing::Message::operator<<(pMVar8,(char (*) [8])" tx_h: ");
      pMVar8 = testing::Message::operator<<(pMVar8,local_60);
      pMVar8 = testing::Message::operator<<(pMVar8,(char (*) [13])", tx_type = ");
      local_7c = (uint)*local_78;
      pMVar8 = testing::Message::operator<<(pMVar8,(int *)&local_7c);
      pSVar12 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar12 = *(SEARCH_METHODS **)
                   gtest_ar.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_fwd_txfm2d_test.cc"
                 ,0x66,(char *)pSVar12);
      testing::internal::AssertHelper::operator=(&local_48,pMVar8);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (local_98._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_98._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    if (*pdVar5 <= actual_max_error && actual_max_error != *pdVar5) {
      iVar7 = (this->super_AV1FwdTxfm2d).count_;
      dVar14 = local_70;
      goto LAB_0062c835;
    }
    uVar2 = (this->super_AV1FwdTxfm2d).txfm2d_size_;
    uVar13 = 0;
    if (0 < (int)uVar2) {
      uVar13 = (ulong)uVar2;
    }
    dVar14 = 0.0;
    for (uVar11 = 0; uVar13 != uVar11; uVar11 = uVar11 + 1) {
      dVar14 = dVar14 + ABS((double)(this->super_AV1FwdTxfm2d).output_[uVar11] -
                            (this->super_AV1FwdTxfm2d).ref_output_[uVar11]);
    }
    dVar14 = local_70 + dVar14 / (double)(int)uVar2;
    iVar9 = iVar9 + 1;
    local_40 = dVar14;
  } while( true );
}

Assistant:

TEST_P(AV1FwdTxfm2d, RunFwdAccuracyCheck) { RunFwdAccuracyCheck(); }